

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O2

void quicly_local_cid_on_sent(quicly_local_cid_set_t *set,size_t num_sent)

{
  uint64_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  en_quicly_local_cid_state_t eVar13;
  undefined4 uVar14;
  en_quicly_local_cid_state_t eVar15;
  undefined4 uVar16;
  quicly_local_cid_t *pqVar17;
  ulong uVar18;
  quicly_local_cid_t *pqVar19;
  ulong uVar20;
  size_t sVar21;
  bool bVar22;
  
  uVar18 = set->_size;
  if (uVar18 < num_sent) {
    __assert_fail("num_sent <= set->_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                  ,0x84,"void quicly_local_cid_on_sent(quicly_local_cid_set_t *, size_t)");
  }
  pqVar17 = set->cids;
  pqVar19 = pqVar17;
  sVar21 = num_sent;
  while( true ) {
    bVar22 = sVar21 == 0;
    sVar21 = sVar21 - 1;
    uVar20 = num_sent;
    if (bVar22) {
      for (; (uVar20 < uVar18 && (pqVar17[num_sent].state == QUICLY_LOCAL_CID_STATE_PENDING));
          pqVar17 = pqVar17 + 1) {
        pqVar19 = pqVar17 + num_sent;
        eVar15 = pqVar17->state;
        uVar16 = *(undefined4 *)&pqVar17->field_0x4;
        uVar1 = pqVar17->sequence;
        uVar2 = *(undefined8 *)(pqVar17->cid).cid;
        uVar3 = *(undefined8 *)((pqVar17->cid).cid + 8);
        uVar4 = *(undefined8 *)((pqVar17->cid).cid + 0x10);
        uVar5 = *(undefined8 *)(pqVar17->stateless_reset_token + 3);
        uVar6 = *(undefined8 *)(pqVar17->stateless_reset_token + 0xb);
        eVar13 = pqVar19->state;
        uVar14 = *(undefined4 *)&pqVar19->field_0x4;
        uVar7 = pqVar19->sequence;
        uVar8 = *(undefined8 *)(pqVar19->cid).cid;
        uVar9 = *(undefined8 *)((pqVar19->cid).cid + 8);
        uVar10 = *(undefined8 *)((pqVar19->cid).cid + 0x10);
        uVar11 = *(undefined8 *)(pqVar19->stateless_reset_token + 3);
        uVar12 = *(undefined8 *)(pqVar19->stateless_reset_token + 0xb);
        *(undefined8 *)((pqVar17->cid).cid + 8) = *(undefined8 *)((pqVar19->cid).cid + 8);
        *(undefined8 *)((pqVar17->cid).cid + 0x10) = uVar10;
        *(undefined8 *)(pqVar17->stateless_reset_token + 3) = uVar11;
        *(undefined8 *)(pqVar17->stateless_reset_token + 0xb) = uVar12;
        pqVar17->state = eVar13;
        *(undefined4 *)&pqVar17->field_0x4 = uVar14;
        pqVar17->sequence = uVar7;
        *(undefined8 *)(pqVar17->cid).cid = uVar8;
        *(undefined8 *)((pqVar17->cid).cid + 8) = uVar9;
        *(undefined8 *)((pqVar19->cid).cid + 8) = uVar3;
        *(undefined8 *)((pqVar19->cid).cid + 0x10) = uVar4;
        *(undefined8 *)(pqVar19->stateless_reset_token + 3) = uVar5;
        *(undefined8 *)(pqVar19->stateless_reset_token + 0xb) = uVar6;
        pqVar19->state = eVar15;
        *(undefined4 *)&pqVar19->field_0x4 = uVar16;
        pqVar19->sequence = uVar1;
        *(undefined8 *)(pqVar19->cid).cid = uVar2;
        *(undefined8 *)((pqVar19->cid).cid + 8) = uVar3;
        uVar18 = set->_size;
        uVar20 = uVar20 + 1;
      }
      return;
    }
    if (pqVar19->state != QUICLY_LOCAL_CID_STATE_PENDING) break;
    pqVar19->state = QUICLY_LOCAL_CID_STATE_INFLIGHT;
    pqVar19 = pqVar19 + 1;
  }
  __assert_fail("set->cids[i].state == QUICLY_LOCAL_CID_STATE_PENDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                ,0x88,"void quicly_local_cid_on_sent(quicly_local_cid_set_t *, size_t)");
}

Assistant:

void quicly_local_cid_on_sent(quicly_local_cid_set_t *set, size_t num_sent)
{
    assert(num_sent <= set->_size);

    /* first, mark the first `num_sent` CIDs as INFLIGHT */
    for (size_t i = 0; i < num_sent; i++) {
        assert(set->cids[i].state == QUICLY_LOCAL_CID_STATE_PENDING);
        set->cids[i].state = QUICLY_LOCAL_CID_STATE_INFLIGHT;
    }

    /* then move the remaining PENDING CIDs (if any) to the front of the array */
    for (size_t i = num_sent; i < set->_size; i++) {
        if (set->cids[i].state != QUICLY_LOCAL_CID_STATE_PENDING)
            break;
        swap_cids(&set->cids[i], &set->cids[i - num_sent]);
    }
}